

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O3

void __thiscall QToolButtonPrivate::onMenuTriggered(QToolButtonPrivate *this,QAction *action)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QAction *local_20;
  void *local_18;
  QAction **local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (action != (QAction *)0x0) {
    lVar3 = (this->actionsCopy).d.size;
    if (lVar3 != 0) {
      lVar4 = 0;
      do {
        if (lVar3 << 3 == lVar4) goto LAB_004bb6f8;
        lVar1 = lVar4 + 8;
        plVar2 = (long *)((long)(this->actionsCopy).d.ptr + lVar4);
        lVar4 = lVar1;
      } while ((QAction *)*plVar2 != action);
      if (lVar1 != 0) goto LAB_004bb71e;
    }
LAB_004bb6f8:
    local_10 = &local_20;
    local_18 = (void *)0x0;
    local_20 = action;
    QMetaObject::activate
              (*(QObject **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8,
               &QToolButton::staticMetaObject,0,&local_18);
  }
LAB_004bb71e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolButtonPrivate::onMenuTriggered(QAction *action)
{
    Q_Q(QToolButton);
    if (action && !actionsCopy.contains(action))
        emit q->triggered(action);
}